

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon.c
# Opt level: O0

void resistcham(void)

{
  uint uVar1;
  monst *pmStack_10;
  int mcham;
  monst *mtmp;
  
  for (pmStack_10 = level->monlist; pmStack_10 != (monst *)0x0; pmStack_10 = pmStack_10->nmon) {
    if (0 < pmStack_10->mhp) {
      uVar1 = *(uint *)&pmStack_10->field_0x60 >> 4 & 7;
      if (uVar1 != 0) {
        *(uint *)&pmStack_10->field_0x60 = *(uint *)&pmStack_10->field_0x60 & 0xffffff8f;
        newcham(level,pmStack_10,mons + cham_to_pm[(int)uVar1],'\0','\0');
      }
      if (((pmStack_10->data->mflags2 & 4) != 0) && (pmStack_10->data->mlet != '5')) {
        new_were(pmStack_10);
      }
      if ((pmStack_10->m_ap_type != '\0') && ((viz_array[pmStack_10->my][pmStack_10->mx] & 2U) != 0)
         ) {
        seemimic(pmStack_10);
        *(uint *)&pmStack_10->field_0x60 = *(uint *)&pmStack_10->field_0x60 & 0xfff7ffff | 0x80000;
      }
    }
  }
  return;
}

Assistant:

void resistcham(void)
{
	struct monst *mtmp;
	int mcham;

	for (mtmp = level->monlist; mtmp; mtmp = mtmp->nmon) {
		if (DEADMONSTER(mtmp)) continue;
		mcham = (int) mtmp->cham;
		if (mcham) {
			mtmp->cham = CHAM_ORDINARY;
			newcham(level, mtmp, &mons[cham_to_pm[mcham]],
				       FALSE, FALSE);
		}
		if (is_were(mtmp->data) && mtmp->data->mlet != S_HUMAN)
			new_were(mtmp);
		if (mtmp->m_ap_type && cansee(mtmp->mx, mtmp->my)) {
			seemimic(mtmp);
			/* we pretend that the mimic doesn't */
			/* know that it has been unmasked.   */
			mtmp->msleeping = 1;
		}
	}
}